

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

int32 __thiscall rw::Frame::count(Frame *this)

{
  int32 count;
  int32 local_c;
  
  local_c = 1;
  forAllChildren(this,countCB,&local_c);
  return local_c;
}

Assistant:

int32
Frame::count(void)
{
	int32 count = 1;
	this->forAllChildren(countCB, (void*)&count);
	return count;
}